

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

string * __thiscall CTxIn::ToString_abi_cxx11_(string *__return_storage_ptr__,CTxIn *this)

{
  uint32_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  CScript *pCVar4;
  uchar *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar6;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string local_90;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"CTxIn(");
  COutPoint::ToString_abi_cxx11_(&local_50,&this->prevout);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  puVar1 = &(this->prevout).n;
  puVar5 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (this,puVar1);
  if (((uint32_t *)puVar5 == puVar1) && (*puVar1 == 0xffffffff)) {
    uVar3 = (this->scriptSig).super_CScriptBase._size;
    uVar6 = uVar3 - 0x1d;
    pCVar4 = (CScript *)(this->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar3 < 0x1d) {
      uVar6 = uVar3;
      pCVar4 = &this->scriptSig;
    }
    s.m_size._0_4_ = uVar6;
    s.m_data = (uchar *)pCVar4;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_70,s);
    tinyformat::format<std::__cxx11::string>
              (&local_50,(tinyformat *)", coinbase %s",(char *)&local_70,in_RCX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_90.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00155e06;
  }
  else {
    uVar3 = (this->scriptSig).super_CScriptBase._size;
    uVar6 = uVar3 - 0x1d;
    pCVar4 = (CScript *)(this->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar3 < 0x1d) {
      uVar6 = uVar3;
      pCVar4 = &this->scriptSig;
    }
    s_00.m_size._0_4_ = uVar6;
    s_00.m_data = (uchar *)pCVar4;
    s_00.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_90,s_00);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,&local_90,0,0x18);
    tinyformat::format<std::__cxx11::string>
              (&local_50,(tinyformat *)", scriptSig=%s",(char *)&local_70,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00155e06;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_00155e06:
  if (this->nSequence != 0xffffffff) {
    tinyformat::format<unsigned_int>(&local_50,", nSequence=%u",&this->nSequence);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,")");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CTxIn::ToString() const
{
    std::string str;
    str += "CTxIn(";
    str += prevout.ToString();
    if (prevout.IsNull())
        str += strprintf(", coinbase %s", HexStr(scriptSig));
    else
        str += strprintf(", scriptSig=%s", HexStr(scriptSig).substr(0, 24));
    if (nSequence != SEQUENCE_FINAL)
        str += strprintf(", nSequence=%u", nSequence);
    str += ")";
    return str;
}